

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

ModifiedRow * __thiscall
QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
          (QMap<int,_QSqlTableModelPrivate::ModifiedRow> *this,int *key)

{
  QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>,_bool>
  pVar3;
  QSqlRecord QStack_88;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_>
  local_80;
  ModifiedRow local_78;
  pair<const_int,_QSqlTableModelPrivate::ModifiedRow> local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_80.d.ptr ==
       (QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
           *)local_80.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_80.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_*>
          )(QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
       *)local_80.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
                        *)local_80.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>,_std::_Select1st<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    QSqlRecord::QSqlRecord(&QStack_88);
    QSqlTableModelPrivate::ModifiedRow::ModifiedRow(&local_78,None,&QStack_88);
    std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>::
    pair<QSqlTableModelPrivate::ModifiedRow,_true>(&local_58,key,&local_78);
    pVar3 = std::
            _Rb_tree<int,std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>,std::_Select1st<std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>>,std::less<int>,std::allocator<std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>>>
            ::_M_insert_unique<std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>>
                      ((_Rb_tree<int,std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>,std::_Select1st<std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>>,std::less<int>,std::allocator<std::pair<int_const,QSqlTableModelPrivate::ModifiedRow>>>
                        *)&pQVar1->m,&local_58);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    QSqlTableModelPrivate::ModifiedRow::~ModifiedRow(&local_58.second);
    QSqlTableModelPrivate::ModifiedRow::~ModifiedRow(&local_78);
    QSqlRecord::~QSqlRecord(&QStack_88);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (ModifiedRow *)&iVar2._M_node[1]._M_parent;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }